

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O3

void * TPZDohrPrecondV2SubDataList<long_double,_TPZDohrSubstructCondense<long_double>_>::ThreadWork
                 (void *voidptr)

{
  TPZDohrAssembleList<long_double> *this;
  TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_> data;
  TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_> local_68;
  TPZAutoPointer<TPZDohrAssembleItem<long_double>_> local_50;
  TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_> local_48;
  
  PopItem(&local_68,
          (TPZDohrPrecondV2SubDataList<long_double,_TPZDohrSubstructCondense<long_double>_> *)
          voidptr);
  if (local_68.fSubStructure.fRef != (TPZReference *)0x0) {
    do {
      if ((local_68.fSubStructure.fRef)->fPointer == (TPZDohrSubstructCondense<long_double> *)0x0)
      break;
      TPZDohrSubstructCondense<long_double>::Contribute_v2_local
                ((local_68.fSubStructure.fRef)->fPointer,(local_68.fInput_local.fRef)->fPointer,
                 &(local_68.fv2_local.fRef)->fPointer->fAssembleData);
      this = (TPZDohrAssembleList<long_double> *)**(undefined8 **)((long)voidptr + 0x40);
      local_50.fRef = local_68.fv2_local.fRef;
      LOCK();
      ((local_68.fv2_local.fRef)->fCounter).super___atomic_base<int>._M_i =
           ((local_68.fv2_local.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      TPZDohrAssembleList<long_double>::AddItem(this,&local_50);
      TPZAutoPointer<TPZDohrAssembleItem<long_double>_>::~TPZAutoPointer(&local_50);
      PopItem(&local_48,
              (TPZDohrPrecondV2SubDataList<long_double,_TPZDohrSubstructCondense<long_double>_> *)
              voidptr);
      TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>::operator=
                (&local_68,&local_48);
      TPZAutoPointer<TPZDohrAssembleItem<long_double>_>::~TPZAutoPointer(&local_48.fv2_local);
      TPZAutoPointer<TPZFMatrix<long_double>_>::~TPZAutoPointer(&local_48.fInput_local);
      TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>::~TPZAutoPointer
                (&local_48.fSubStructure);
    } while (local_68.fSubStructure.fRef != (TPZReference *)0x0);
  }
  TPZAutoPointer<TPZDohrAssembleItem<long_double>_>::~TPZAutoPointer(&local_68.fv2_local);
  TPZAutoPointer<TPZFMatrix<long_double>_>::~TPZAutoPointer(&local_68.fInput_local);
  TPZAutoPointer<TPZDohrSubstructCondense<long_double>_>::~TPZAutoPointer(&local_68.fSubStructure);
  return voidptr;
}

Assistant:

void *TPZDohrPrecondV2SubDataList<TVar,TSubStruct>::ThreadWork(void *voidptr)
{
	TPZDohrPrecondV2SubDataList<TVar,TSubStruct>	*myptr = (TPZDohrPrecondV2SubDataList<TVar,TSubStruct> *) voidptr;
	TPZDohrPrecondV2SubData<TVar,TSubStruct> data = myptr->PopItem();
	while (data.IsValid()) {
		data.fSubStructure->Contribute_v2_local(data.fInput_local,data.fv2_local->fAssembleData);
		myptr->fAssemblyStructure->AddItem(data.fv2_local);
		data = myptr->PopItem();
	}
	return voidptr;
}